

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashGrowTable(SyHash *pHash)

{
  sxu32 sVar1;
  uint uVar2;
  SyHashEntry_Pr **pSrc;
  uint local_34;
  sxu32 iBucket;
  sxu32 n;
  SyHashEntry_Pr **apNew;
  SyHashEntry_Pr *pEntry;
  sxu32 nNewSize;
  SyHash *pHash_local;
  
  sVar1 = pHash->nBucketSize;
  pSrc = (SyHashEntry_Pr **)SyMemBackendAlloc(pHash->pAllocator,sVar1 << 4);
  if (pSrc != (SyHashEntry_Pr **)0x0) {
    SyZero(pSrc,sVar1 << 4);
    local_34 = 0;
    apNew = (SyHashEntry_Pr **)pHash->pList;
    for (; local_34 < pHash->nEntry; local_34 = local_34 + 1) {
      apNew[8] = (SyHashEntry_Pr *)0x0;
      apNew[7] = (SyHashEntry_Pr *)0x0;
      uVar2 = *(uint *)(apNew + 3) & sVar1 * 2 - 1;
      apNew[7] = pSrc[uVar2];
      if (pSrc[uVar2] != (SyHashEntry_Pr *)0x0) {
        pSrc[uVar2]->pPrevCollide = (SyHashEntry_Pr *)apNew;
      }
      pSrc[uVar2] = (SyHashEntry_Pr *)apNew;
      apNew = (SyHashEntry_Pr **)apNew[5];
    }
    SyMemBackendFree(pHash->pAllocator,pHash->apBucket);
    pHash->apBucket = pSrc;
    pHash->nBucketSize = sVar1 * 2;
  }
  return 0;
}

Assistant:

static sxi32 HashGrowTable(SyHash *pHash)
{
	sxu32 nNewSize = pHash->nBucketSize * 2;
	SyHashEntry_Pr *pEntry;
	SyHashEntry_Pr **apNew;
	sxu32 n, iBucket;

	/* Allocate a new larger table */
	apNew = (SyHashEntry_Pr **)SyMemBackendAlloc(pHash->pAllocator, nNewSize * sizeof(SyHashEntry_Pr *));
	if( apNew == 0 ){
		/* Not so fatal, simply a performance hit */
		return SXRET_OK;
	}
	/* Zero the new table */
	SyZero((void *)apNew, nNewSize * sizeof(SyHashEntry_Pr *));
	/* Rehash all entries */
	for( n = 0, pEntry = pHash->pList; n < pHash->nEntry ; n++  ){
		pEntry->pNextCollide = pEntry->pPrevCollide = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextCollide = apNew[iBucket];
		if( apNew[iBucket] != 0 ){
			apNew[iBucket]->pPrevCollide = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
	}
	/* Release the old table and reflect the change */
	SyMemBackendFree(pHash->pAllocator, (void *)pHash->apBucket);
	pHash->apBucket = apNew;
	pHash->nBucketSize = nNewSize;
	return SXRET_OK;
}